

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O0

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  uchar *elem_ptr_2;
  uchar *ptr_2;
  Mat m_4;
  int srck_2;
  int srcq_1;
  int k_2;
  uchar *out_elem_ptr_2;
  int j_2;
  uchar *outptr_2;
  int i_2;
  int z;
  Mat out_1;
  int q_1;
  size_t lane_size_2;
  size_t out_elemsize_3;
  int outc_1;
  uchar *elem_ptr_1;
  uchar *ptr_1;
  Mat m_1;
  int srck_1;
  int srcq;
  int k_1;
  uchar *out_elem_ptr_1;
  int j_1;
  uchar *outptr_1;
  int i_1;
  Mat out;
  int q;
  size_t lane_size_1;
  size_t out_elemsize_2;
  int outc;
  uchar *elem_ptr;
  uchar *ptr;
  int srck;
  int srcy;
  int k;
  uchar *out_elem_ptr;
  int j;
  uchar *outptr;
  int i;
  size_t lane_size;
  size_t out_elemsize_1;
  int outh;
  size_t out_elemsize;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elempack;
  Mat *m_3;
  Mat *m;
  Mat *m_5;
  Mat *m_2;
  size_t in_stack_fffffffffffff7a8;
  void **ppvVar3;
  Allocator *in_stack_fffffffffffff7b0;
  int _d;
  size_t in_stack_fffffffffffff7b8;
  int _w;
  Mat *in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7c8;
  int _w_00;
  Mat *in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff820;
  Allocator *in_stack_fffffffffffff828;
  Allocator *in_stack_fffffffffffff830;
  void *local_710;
  int *local_708;
  ulong local_700;
  undefined4 local_6f8;
  long *local_6f0;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  ulong local_6d0;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  void *local_6b8;
  int local_6ac;
  void *local_6a8;
  int local_6a0;
  int local_69c;
  void *local_698;
  int *local_690;
  ulong local_688;
  undefined4 local_680;
  long *local_678;
  int local_670;
  int local_66c;
  int local_668;
  undefined4 local_664;
  undefined4 local_660;
  ulong local_658;
  int local_64c;
  ulong local_648;
  ulong local_640;
  int local_634;
  void *local_630;
  void *local_628;
  void *local_620;
  int *local_618;
  ulong local_610;
  undefined4 local_608;
  long *local_600;
  int local_5f8;
  int local_5f4;
  int local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  ulong local_5e0;
  int local_5d4;
  int local_5d0;
  int local_5cc;
  void *local_5c8;
  int local_5c0;
  void *local_5b0;
  int local_5a4;
  void *local_5a0;
  int *local_598;
  ulong local_590;
  undefined4 local_588;
  long *local_580;
  int local_578;
  int local_574;
  int local_570;
  undefined4 local_56c;
  undefined4 local_568;
  ulong local_560;
  int local_554;
  ulong local_550;
  ulong local_548;
  int local_53c;
  long local_538;
  long local_530;
  int local_524;
  int local_520;
  int local_51c;
  long local_518;
  int local_50c;
  long local_508;
  int local_4fc;
  ulong local_4f8;
  ulong local_4f0;
  int local_4e4;
  long local_4e0;
  int local_4d4;
  ulong local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  long *local_4a8;
  long *local_4a0;
  int local_48c;
  int local_488;
  undefined4 local_484;
  long *local_480;
  int local_468;
  undefined4 local_464;
  long *local_460;
  int local_448;
  undefined4 local_444;
  long *local_440;
  int local_428;
  undefined4 local_424;
  long *local_420;
  int local_408;
  undefined4 local_404;
  long *local_400;
  long *local_3e8;
  long *local_3e0;
  long *local_3d8;
  long *local_3d0;
  void **local_3c8;
  void **local_3c0;
  long *local_3b8;
  void **local_3b0;
  void **local_3a8;
  long *local_3a0;
  undefined1 local_395;
  int local_394;
  void **local_388;
  undefined1 local_37d;
  int local_37c;
  void **local_370;
  undefined1 local_365;
  int local_364;
  long *local_360;
  void **local_358;
  undefined1 local_34d;
  int local_34c;
  long *local_348;
  void **local_340;
  void **local_318;
  void **local_308;
  void **local_2f8;
  void **local_2e8;
  int local_2c8;
  undefined4 local_2c4;
  void **local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_218;
  undefined4 local_214;
  int local_208;
  undefined4 local_204;
  int local_1f8;
  undefined4 local_1f4;
  int local_1e8;
  undefined4 local_1e4;
  int local_1d8;
  undefined4 local_1d4;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  void *local_1a8;
  void *local_180;
  void *local_170;
  void *local_160;
  void *local_150;
  long *local_140;
  long *local_138;
  long *local_130;
  long *local_128;
  long *local_120;
  undefined4 local_114;
  ulong local_110;
  void *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  void **local_f0;
  long *local_e8;
  undefined4 local_dc;
  ulong local_d8;
  void *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  void **local_b8;
  long *local_b0;
  undefined4 local_a4;
  ulong local_a0;
  void *local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  void **local_80;
  long *local_78;
  undefined4 local_6c;
  ulong local_68;
  void *local_60;
  undefined4 local_54;
  int local_50;
  int local_4c;
  void **local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_4b4 = (int)in_RSI[3];
  if (local_4b4 == *(int *)(in_RDI + 0xd0)) {
    if (in_RDX != in_RSI) {
      if (in_RSI[1] != 0) {
        piVar1 = (int *)in_RSI[1];
        local_404 = 1;
        LOCK();
        local_408 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_400 = in_RSI;
      if (in_RDX[1] != 0) {
        piVar1 = (int *)in_RDX[1];
        local_214 = 0xffffffff;
        LOCK();
        local_218 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_218 == 1) {
          if (in_RDX[4] == 0) {
            local_1a8 = (void *)*in_RDX;
            if (local_1a8 != (void *)0x0) {
              free(local_1a8);
            }
          }
          else {
            (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
          }
        }
      }
      *in_RDX = 0;
      in_RDX[2] = 0;
      *(undefined4 *)(in_RDX + 3) = 0;
      *(undefined4 *)(in_RDX + 5) = 0;
      *(undefined4 *)((long)in_RDX + 0x2c) = 0;
      *(undefined4 *)(in_RDX + 6) = 0;
      *(undefined4 *)((long)in_RDX + 0x34) = 0;
      *(undefined4 *)(in_RDX + 7) = 0;
      in_RDX[8] = 0;
      in_RDX[1] = 0;
      *in_RDX = *local_400;
      in_RDX[1] = local_400[1];
      in_RDX[2] = local_400[2];
      *(int *)(in_RDX + 3) = (int)local_400[3];
      in_RDX[4] = local_400[4];
      *(int *)(in_RDX + 5) = (int)local_400[5];
      *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_400 + 0x2c);
      *(int *)(in_RDX + 6) = (int)local_400[6];
      *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_400 + 0x34);
      *(int *)(in_RDX + 7) = (int)local_400[7];
      in_RDX[8] = local_400[8];
    }
    return 0;
  }
  local_4b8 = *(int *)((long)in_RSI + 0x2c);
  local_4bc = (int)in_RSI[6];
  local_4c0 = *(int *)((long)in_RSI + 0x34);
  local_4c4 = (int)in_RSI[7];
  local_4c8 = (int)in_RSI[5];
  local_4d0 = in_RSI[2];
  if (*(int *)(in_RDI + 0xd4) == 0) {
    if ((local_4c8 == 1) && ((local_4b8 * local_4b4) % *(int *)(in_RDI + 0xd0) != 0)) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          piVar1 = (int *)in_RSI[1];
          local_424 = 1;
          LOCK();
          local_428 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_420 = in_RSI;
        if (in_RDX[1] != 0) {
          piVar1 = (int *)in_RDX[1];
          local_204 = 0xffffffff;
          LOCK();
          local_208 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_208 == 1) {
            if (in_RDX[4] == 0) {
              local_1b0 = (void *)*in_RDX;
              if (local_1b0 != (void *)0x0) {
                free(local_1b0);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *local_420;
        in_RDX[1] = local_420[1];
        in_RDX[2] = local_420[2];
        *(int *)(in_RDX + 3) = (int)local_420[3];
        in_RDX[4] = local_420[4];
        *(int *)(in_RDX + 5) = (int)local_420[5];
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_420 + 0x2c);
        *(int *)(in_RDX + 6) = (int)local_420[6];
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_420 + 0x34);
        *(int *)(in_RDX + 7) = (int)local_420[7];
        in_RDX[8] = local_420[8];
      }
      return 0;
    }
    if ((local_4c8 == 2) && ((local_4bc * local_4b4) % *(int *)(in_RDI + 0xd0) != 0)) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          piVar1 = (int *)in_RSI[1];
          local_444 = 1;
          LOCK();
          local_448 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_440 = in_RSI;
        if (in_RDX[1] != 0) {
          piVar1 = (int *)in_RDX[1];
          local_1f4 = 0xffffffff;
          LOCK();
          local_1f8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1f8 == 1) {
            if (in_RDX[4] == 0) {
              local_1b8 = (void *)*in_RDX;
              if (local_1b8 != (void *)0x0) {
                free(local_1b8);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *local_440;
        in_RDX[1] = local_440[1];
        in_RDX[2] = local_440[2];
        *(int *)(in_RDX + 3) = (int)local_440[3];
        in_RDX[4] = local_440[4];
        *(int *)(in_RDX + 5) = (int)local_440[5];
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_440 + 0x2c);
        *(int *)(in_RDX + 6) = (int)local_440[6];
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_440 + 0x34);
        *(int *)(in_RDX + 7) = (int)local_440[7];
        in_RDX[8] = local_440[8];
      }
      return 0;
    }
    if (((local_4c8 == 3) || (local_4c8 == 4)) &&
       ((local_4c4 * local_4b4) % *(int *)(in_RDI + 0xd0) != 0)) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          piVar1 = (int *)in_RSI[1];
          local_464 = 1;
          LOCK();
          local_468 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_460 = in_RSI;
        if (in_RDX[1] != 0) {
          piVar1 = (int *)in_RDX[1];
          local_1e4 = 0xffffffff;
          LOCK();
          local_1e8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1e8 == 1) {
            if (in_RDX[4] == 0) {
              local_1c0 = (void *)*in_RDX;
              if (local_1c0 != (void *)0x0) {
                free(local_1c0);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *local_460;
        in_RDX[1] = local_460[1];
        in_RDX[2] = local_460[2];
        *(int *)(in_RDX + 3) = (int)local_460[3];
        in_RDX[4] = local_460[4];
        *(int *)(in_RDX + 5) = (int)local_460[5];
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_460 + 0x2c);
        *(int *)(in_RDX + 6) = (int)local_460[6];
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_460 + 0x34);
        *(int *)(in_RDX + 7) = (int)local_460[7];
        in_RDX[8] = local_460[8];
      }
      return 0;
    }
  }
  _w = (int)(in_stack_fffffffffffff7b8 >> 0x20);
  _w_00 = (int)((ulong)in_stack_fffffffffffff7c8 >> 0x20);
  local_4a8 = in_RDX;
  local_4a0 = in_RSI;
  if (local_4c8 == 1) {
    if (*(int *)(in_RDI + 0xd0) == 1) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          piVar1 = (int *)in_RSI[1];
          local_484 = 1;
          LOCK();
          local_488 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_480 = in_RSI;
        if (in_RDX[1] != 0) {
          piVar1 = (int *)in_RDX[1];
          local_1d4 = 0xffffffff;
          LOCK();
          local_1d8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_1d8 == 1) {
            if (in_RDX[4] == 0) {
              local_1c8 = (void *)*in_RDX;
              if (local_1c8 != (void *)0x0) {
                free(local_1c8);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *local_480;
        in_RDX[1] = local_480[1];
        in_RDX[2] = local_480[2];
        *(int *)(in_RDX + 3) = (int)local_480[3];
        in_RDX[4] = local_480[4];
        *(int *)(in_RDX + 5) = (int)local_480[5];
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_480 + 0x2c);
        *(int *)(in_RDX + 6) = (int)local_480[6];
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_480 + 0x34);
        *(int *)(in_RDX + 7) = (int)local_480[7];
        in_RDX[8] = local_480[8];
      }
      *(int *)((long)local_4a8 + 0x2c) = local_4b8 * local_4b4;
      local_4a8[8] = (long)local_4b8 * (long)local_4b4;
      local_4a8[2] = local_4d0 / (ulong)(long)local_4b4;
      *(undefined4 *)(local_4a8 + 3) = *(undefined4 *)(in_RDI + 0xd0);
      local_48c = 0;
    }
    else {
      local_4d4 = (local_4b8 * local_4b4 + *(int *)(in_RDI + 0xd0) + -1) / *(int *)(in_RDI + 0xd0);
      local_4e0 = (local_4d0 / (ulong)(long)local_4b4) * (long)*(int *)(in_RDI + 0xd0);
      Mat::create(in_stack_fffffffffffff7d0,_w_00,(size_t)in_stack_fffffffffffff7c0,_w,
                  in_stack_fffffffffffff7b0);
      local_3d0 = local_4a8;
      bVar2 = true;
      if (*local_4a8 != 0) {
        local_140 = local_4a8;
        bVar2 = local_4a8[8] * (long)(int)local_4a8[7] == 0;
      }
      if (bVar2) {
        local_48c = -100;
      }
      else {
        memcpy((void *)*local_4a8,(void *)*local_4a0,(long)local_4b8 * local_4d0);
        local_48c = 0;
      }
    }
  }
  else if (local_4c8 == 2) {
    local_4e4 = (local_4bc * local_4b4 + *(int *)(in_RDI + 0xd0) + -1) / *(int *)(in_RDI + 0xd0);
    local_4f0 = (local_4d0 / (ulong)(long)local_4b4) * (long)*(int *)(in_RDI + 0xd0);
    local_4f8 = local_4f0 / (ulong)(long)*(int *)(in_RDI + 0xd0);
    Mat::create(in_stack_fffffffffffff7d0,_w_00,(int)in_stack_fffffffffffff7c8,
                (size_t)in_stack_fffffffffffff7c0,_w,in_stack_fffffffffffff7b0);
    local_3d8 = local_4a8;
    bVar2 = true;
    if (*local_4a8 != 0) {
      local_138 = local_4a8;
      bVar2 = local_4a8[8] * (long)(int)local_4a8[7] == 0;
    }
    if (bVar2) {
      local_48c = -100;
    }
    else {
      for (local_4fc = 0; local_4fc < local_4e4; local_4fc = local_4fc + 1) {
        local_3b8 = local_4a8;
        local_508 = *local_4a8 + (long)local_4fc * (long)local_4b8 * local_4f0;
        for (local_50c = 0; local_50c < local_4b8; local_50c = local_50c + 1) {
          local_518 = local_508 + (long)local_50c * local_4f0;
          for (local_51c = 0;
              (local_51c < *(int *)(in_RDI + 0xd0) &&
              (local_520 = (local_4fc * *(int *)(in_RDI + 0xd0) + local_51c) / local_4b4,
              local_520 < local_4bc)); local_51c = local_51c + 1) {
            local_524 = (local_4fc * *(int *)(in_RDI + 0xd0) + local_51c) % local_4b4;
            local_3a0 = local_4a0;
            local_530 = *local_4a0 + (long)local_520 * (long)local_4b8 * local_4d0;
            local_538 = local_530 + (long)local_50c * local_4d0;
            memcpy((void *)(local_518 + (long)local_51c * local_4f8),
                   (void *)(local_538 + (long)local_524 * local_4f8),local_4f8);
          }
        }
      }
      local_48c = 0;
    }
  }
  else {
    _d = (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20);
    if (local_4c8 == 3) {
      local_53c = (local_4c4 * local_4b4 + *(int *)(in_RDI + 0xd0) + -1) / *(int *)(in_RDI + 0xd0);
      local_548 = (local_4d0 / (ulong)(long)local_4b4) * (long)*(int *)(in_RDI + 0xd0);
      local_550 = local_548 / (ulong)(long)*(int *)(in_RDI + 0xd0);
      Mat::create(in_stack_fffffffffffff7d0,_w_00,(int)in_stack_fffffffffffff7c8,
                  (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8,_d,
                  in_stack_fffffffffffff830);
      local_3e0 = local_4a8;
      bVar2 = true;
      if (*local_4a8 != 0) {
        local_130 = local_4a8;
        bVar2 = local_4a8[8] * (long)(int)local_4a8[7] == 0;
      }
      if (bVar2) {
        local_48c = -100;
      }
      else {
        for (local_554 = 0; local_554 < local_53c; local_554 = local_554 + 1) {
          local_370 = &local_5a0;
          local_84 = *(int *)((long)local_4a8 + 0x2c);
          local_88 = (int)local_4a8[6];
          local_8c = *(undefined4 *)((long)local_4a8 + 0x34);
          local_98 = (void *)(*local_4a8 + local_4a8[8] * (long)local_554 * local_4a8[2]);
          local_a0 = local_4a8[2];
          local_a4 = (undefined4)local_4a8[3];
          local_b0 = (long *)local_4a8[4];
          local_80 = &local_5a0;
          local_598 = (int *)0x0;
          local_56c = 1;
          local_28 = (long)local_84 * (long)local_88 * local_a0;
          local_560 = (local_28 + 0xfU & 0xfffffffffffffff0) / local_a0;
          local_578 = (int)local_4a8[5] + -1;
          if ((int)local_4a8[5] == 4) {
            local_560 = (long)*(int *)((long)local_4a8 + 0x2c) * (long)(int)local_4a8[6];
          }
          local_2c = 0x10;
          local_37c = local_554;
          local_37d = 1;
          local_5a0 = local_98;
          local_590 = local_a0;
          local_588 = local_a4;
          local_580 = local_b0;
          local_574 = local_84;
          local_570 = local_88;
          local_568 = local_8c;
          for (local_5a4 = 0; local_5a4 < local_4bc; local_5a4 = local_5a4 + 1) {
            local_3c0 = &local_5a0;
            local_5b0 = (void *)((long)local_5a0 + (long)local_5a4 * (long)local_4b8 * local_548);
            for (local_5c0 = 0; local_5c0 < local_4b8; local_5c0 = local_5c0 + 1) {
              local_5c8 = (void *)((long)local_5b0 + (long)local_5c0 * local_548);
              for (local_5cc = 0;
                  (local_5cc < *(int *)(in_RDI + 0xd0) &&
                  (local_5d0 = (local_554 * *(int *)(in_RDI + 0xd0) + local_5cc) / local_4b4,
                  local_5d0 < local_4c4)); local_5cc = local_5cc + 1) {
                local_5d4 = (local_554 * *(int *)(in_RDI + 0xd0) + local_5cc) % local_4b4;
                local_340 = &local_620;
                local_348 = local_4a0;
                local_f4 = *(int *)((long)local_4a0 + 0x2c);
                local_f8 = (int)local_4a0[6];
                local_fc = *(undefined4 *)((long)local_4a0 + 0x34);
                local_108 = (void *)(*local_4a0 + local_4a0[8] * (long)local_5d0 * local_4a0[2]);
                local_110 = local_4a0[2];
                local_114 = (undefined4)local_4a0[3];
                local_120 = (long *)local_4a0[4];
                local_f0 = &local_620;
                local_618 = (int *)0x0;
                local_5ec = 1;
                local_8 = (long)local_f4 * (long)local_f8 * local_110;
                local_c = 0x10;
                local_5e0 = (local_8 + 0xfU & 0xfffffffffffffff0) / local_110;
                local_5f8 = (int)local_4a0[5] + -1;
                if ((int)local_4a0[5] == 4) {
                  local_5e0 = (long)*(int *)((long)local_4a0 + 0x2c) * (long)(int)local_4a0[6];
                }
                local_34d = 1;
                local_3a8 = &local_620;
                local_628 = (void *)((long)local_108 + (long)local_5a4 * (long)local_4b8 * local_4d0
                                    );
                local_630 = (void *)((long)local_628 + (long)local_5c0 * local_4d0);
                local_34c = local_5d0;
                local_620 = local_108;
                local_610 = local_110;
                local_608 = local_114;
                local_600 = local_120;
                local_5f4 = local_f4;
                local_5f0 = local_f8;
                local_5e8 = local_fc;
                memcpy((void *)((long)local_5c8 + (long)local_5cc * local_550),
                       (void *)((long)local_630 + (long)local_5d4 * local_550),local_550);
                local_318 = &local_620;
                local_260 = local_318;
                if (local_618 != (int *)0x0) {
                  local_264 = 0xffffffff;
                  LOCK();
                  local_268 = *local_618;
                  *local_618 = *local_618 + -1;
                  UNLOCK();
                  if (local_268 == 1) {
                    if (local_600 == (long *)0x0) {
                      local_180 = local_620;
                      if (local_620 != (void *)0x0) {
                        free(local_620);
                      }
                    }
                    else {
                      (**(code **)(*local_600 + 0x18))(local_600,local_620);
                    }
                  }
                }
                local_620 = (void *)0x0;
                local_610 = 0;
                local_608 = 0;
                local_5f8 = 0;
                local_5f4 = 0;
                local_5f0 = 0;
                local_5ec = 0;
                local_5e8 = 0;
                local_5e0 = 0;
                local_618 = (int *)0x0;
              }
            }
          }
          local_308 = &local_5a0;
          local_280 = local_308;
          if (local_598 != (int *)0x0) {
            local_284 = 0xffffffff;
            LOCK();
            local_288 = *local_598;
            *local_598 = *local_598 + -1;
            UNLOCK();
            if (local_288 == 1) {
              if (local_580 == (long *)0x0) {
                local_170 = local_5a0;
                if (local_5a0 != (void *)0x0) {
                  free(local_5a0);
                }
              }
              else {
                (**(code **)(*local_580 + 0x18))(local_580,local_5a0);
              }
            }
          }
        }
        local_48c = 0;
      }
    }
    else if (local_4c8 == 4) {
      local_634 = (local_4c4 * local_4b4 + *(int *)(in_RDI + 0xd0) + -1) / *(int *)(in_RDI + 0xd0);
      local_640 = (local_4d0 / (ulong)(long)local_4b4) * (long)*(int *)(in_RDI + 0xd0);
      local_648 = local_640 / (ulong)(long)*(int *)(in_RDI + 0xd0);
      Mat::create(in_stack_fffffffffffff7c0,_w,(int)in_stack_fffffffffffff7b8,_d,
                  (int)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,in_stack_fffffffffffff820
                  ,in_stack_fffffffffffff828);
      local_3e8 = local_4a8;
      bVar2 = true;
      if (*local_4a8 != 0) {
        local_128 = local_4a8;
        bVar2 = local_4a8[8] * (long)(int)local_4a8[7] == 0;
      }
      if (bVar2) {
        local_48c = -100;
      }
      else {
        for (local_64c = 0; local_64c < local_634; local_64c = local_64c + 1) {
          local_388 = &local_698;
          local_4c = *(int *)((long)local_4a8 + 0x2c);
          local_50 = (int)local_4a8[6];
          local_54 = *(undefined4 *)((long)local_4a8 + 0x34);
          local_60 = (void *)(*local_4a8 + local_4a8[8] * (long)local_64c * local_4a8[2]);
          local_68 = local_4a8[2];
          local_6c = (undefined4)local_4a8[3];
          local_78 = (long *)local_4a8[4];
          local_48 = &local_698;
          local_690 = (int *)0x0;
          local_664 = 1;
          local_38 = (long)local_4c * (long)local_50 * local_68;
          local_658 = (local_38 + 0xfU & 0xfffffffffffffff0) / local_68;
          local_670 = (int)local_4a8[5] + -1;
          if ((int)local_4a8[5] == 4) {
            local_658 = (long)*(int *)((long)local_4a8 + 0x2c) * (long)(int)local_4a8[6];
          }
          local_3c = 0x10;
          local_394 = local_64c;
          local_395 = 1;
          local_698 = local_60;
          local_688 = local_68;
          local_680 = local_6c;
          local_678 = local_78;
          local_66c = local_4c;
          local_668 = local_50;
          local_660 = local_54;
          for (local_69c = 0; local_69c < local_4c0; local_69c = local_69c + 1) {
            for (local_6a0 = 0; local_6a0 < local_4bc; local_6a0 = local_6a0 + 1) {
              local_3c8 = &local_698;
              local_6a8 = (void *)((long)local_698 +
                                  (long)(local_69c * local_4bc + local_6a0) * (long)local_4b8 *
                                  local_640);
              for (local_6ac = 0; local_6ac < local_4b8; local_6ac = local_6ac + 1) {
                local_6b8 = (void *)((long)local_6a8 + (long)local_6ac * local_640);
                for (local_6bc = 0;
                    (local_6bc < *(int *)(in_RDI + 0xd0) &&
                    (local_6c0 = (local_64c * *(int *)(in_RDI + 0xd0) + local_6bc) / local_4b4,
                    local_6c0 < local_4c4)); local_6bc = local_6bc + 1) {
                  local_6c4 = (local_64c * *(int *)(in_RDI + 0xd0) + local_6bc) % local_4b4;
                  local_358 = &local_710;
                  local_360 = local_4a0;
                  local_bc = *(int *)((long)local_4a0 + 0x2c);
                  local_c0 = (int)local_4a0[6];
                  local_c4 = *(undefined4 *)((long)local_4a0 + 0x34);
                  local_d0 = (void *)(*local_4a0 + local_4a0[8] * (long)local_6c0 * local_4a0[2]);
                  local_d8 = local_4a0[2];
                  local_dc = (undefined4)local_4a0[3];
                  local_e8 = (long *)local_4a0[4];
                  local_b8 = &local_710;
                  local_708 = (int *)0x0;
                  local_6dc = 1;
                  local_18 = (long)local_bc * (long)local_c0 * local_d8;
                  local_1c = 0x10;
                  local_6d0 = (local_18 + 0xfU & 0xfffffffffffffff0) / local_d8;
                  local_6e8 = (int)local_4a0[5] + -1;
                  if ((int)local_4a0[5] == 4) {
                    local_6d0 = (long)*(int *)((long)local_4a0 + 0x2c) * (long)(int)local_4a0[6];
                  }
                  local_365 = 1;
                  local_3b0 = &local_710;
                  local_364 = local_6c0;
                  local_710 = local_d0;
                  local_700 = local_d8;
                  local_6f8 = local_dc;
                  local_6f0 = local_e8;
                  local_6e4 = local_bc;
                  local_6e0 = local_c0;
                  local_6d8 = local_c4;
                  memcpy((void *)((long)local_6b8 + (long)local_6bc * local_648),
                         (void *)((long)local_d0 +
                                 (long)local_6c4 * local_648 +
                                 (long)local_6ac * local_4d0 +
                                 (long)(local_69c * local_4bc + local_6a0) * (long)local_4b8 *
                                 local_4d0),local_648);
                  ppvVar3 = &local_710;
                  local_2f8 = ppvVar3;
                  local_2a0 = ppvVar3;
                  if (local_708 != (int *)0x0) {
                    local_2a4 = 0xffffffff;
                    LOCK();
                    local_2a8 = *local_708;
                    *local_708 = *local_708 + -1;
                    UNLOCK();
                    if (local_2a8 == 1) {
                      if (local_6f0 == (long *)0x0) {
                        local_160 = local_710;
                        if (local_710 != (void *)0x0) {
                          free(local_710);
                        }
                      }
                      else {
                        (**(code **)(*local_6f0 + 0x18))(local_6f0,local_710);
                      }
                    }
                  }
                  *ppvVar3 = (void *)0x0;
                  ppvVar3[2] = (void *)0x0;
                  *(undefined4 *)(ppvVar3 + 3) = 0;
                  *(undefined4 *)(ppvVar3 + 5) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
                  *(undefined4 *)(ppvVar3 + 6) = 0;
                  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
                  *(undefined4 *)(ppvVar3 + 7) = 0;
                  ppvVar3[8] = (void *)0x0;
                  ppvVar3[1] = (void *)0x0;
                }
              }
            }
          }
          ppvVar3 = &local_698;
          local_2e8 = ppvVar3;
          local_2c0 = ppvVar3;
          if (local_690 != (int *)0x0) {
            local_2c4 = 0xffffffff;
            LOCK();
            local_2c8 = *local_690;
            *local_690 = *local_690 + -1;
            UNLOCK();
            if (local_2c8 == 1) {
              if (local_678 == (long *)0x0) {
                local_150 = local_698;
                if (local_698 != (void *)0x0) {
                  free(local_698);
                }
              }
              else {
                (**(code **)(*local_678 + 0x18))(local_678,local_698);
              }
            }
          }
          *ppvVar3 = (void *)0x0;
          ppvVar3[2] = (void *)0x0;
          *(undefined4 *)(ppvVar3 + 3) = 0;
          *(undefined4 *)(ppvVar3 + 5) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
          *(undefined4 *)(ppvVar3 + 6) = 0;
          *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
          *(undefined4 *)(ppvVar3 + 7) = 0;
          ppvVar3[8] = (void *)0x0;
          ppvVar3[1] = (void *)0x0;
        }
        local_48c = 0;
      }
    }
    else {
      local_48c = 0;
    }
  }
  return local_48c;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = (size_t)w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + (size_t)i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + (size_t)srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + (size_t)i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + (size_t)i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    unsigned char* outptr = (unsigned char*)out + (size_t)(z * h + i) * w * out_elemsize;

                    for (int j = 0; j < w; j++)
                    {
                        unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                        for (int k = 0; k < out_elempack; k++)
                        {
                            int srcq = (q * out_elempack + k) / elempack;
                            if (srcq >= channels)
                                break;

                            int srck = (q * out_elempack + k) % elempack;

                            const Mat m = bottom_blob.channel(srcq);
                            const unsigned char* ptr = (const unsigned char*)m + (size_t)(z * h + i) * w * elemsize;
                            const unsigned char* elem_ptr = ptr + j * elemsize;

                            memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                        }
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}